

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase266::run(TestCase266 *this)

{
  bool bVar1;
  bool local_195;
  int local_194;
  bool _kj_shouldLog_5;
  DebugExpression<unsigned_int_&> DStack_190;
  undefined1 local_188 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_5;
  uint local_158;
  uchar local_153;
  SafeUnwrapper<255UL,_unsigned_char> local_152;
  bool _kj_shouldLog_4;
  undefined1 local_150 [8];
  DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> _kjCondition_4;
  Bounded<255UL,_unsigned_char> value_2;
  Bounded<255UL,_unsigned_char> i_2;
  Iterator __end2_2;
  Iterator __begin2_2;
  Range<kj::Bounded<255UL,_unsigned_char>_> *__range2_2;
  bool _kj_shouldLog_3;
  DebugExpression<unsigned_int_&> DStack_118;
  undefined1 local_110 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_3;
  uint local_e0;
  uchar local_db;
  SafeUnwrapper<255UL,_unsigned_char> local_da;
  bool _kj_shouldLog_2;
  undefined1 local_d8 [8];
  DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> _kjCondition_2;
  Bounded<255UL,_unsigned_char> value_1;
  Bounded<255UL,_unsigned_char> i_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  Range<kj::Bounded<255UL,_unsigned_char>_> *__range2_1;
  bool _kj_shouldLog_1;
  DebugExpression<unsigned_int_&> DStack_a0;
  undefined1 local_98 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_1;
  uint local_68;
  undefined1 local_63;
  SafeUnwrapper<10UL,_unsigned_char> local_62;
  bool _kj_shouldLog;
  undefined1 local_60 [8];
  DebugComparison<kj::SafeUnwrapper<10UL,_unsigned_char>,_unsigned_int> _kjCondition;
  Bounded<10UL,_unsigned_int> local_38;
  Iterator IStack_34;
  Bounded<10UL,_unsigned_char> value;
  Bounded<10UL,_unsigned_int> i;
  Iterator __end2;
  Iterator __begin2;
  Range<kj::Bounded<10UL,_unsigned_int>_> *__range2;
  TestCase266 *pTStack_10;
  uint expected;
  TestCase266 *this_local;
  
  __range2._4_4_ = 0;
  pTStack_10 = this;
  bounded<10u>();
  ___begin2 = (Range<unsigned_int>)zeroTo<10u>();
  i.value = (uint)Range<kj::Bounded<10UL,_unsigned_int>_>::begin
                            ((Range<kj::Bounded<10UL,_unsigned_int>_> *)&__begin2);
  IStack_34 = Range<kj::Bounded<10UL,_unsigned_int>_>::end
                        ((Range<kj::Bounded<10UL,_unsigned_int>_> *)&__begin2);
  while (bVar1 = Range<kj::Bounded<10UL,_unsigned_int>_>::Iterator::operator==
                           ((Iterator *)&i,&stack0xffffffffffffffcc), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_38 = Range<kj::Bounded<10UL,_unsigned_int>_>::Iterator::operator*((Iterator *)&i);
    Bounded<10ul,unsigned_char>::Bounded<10ul,unsigned_int>
              ((Bounded<10ul,unsigned_char> *)&_kjCondition.field_0x1f,&local_38);
    local_63 = _kjCondition._31_1_;
    local_62 = unbound<10ul,unsigned_char>((Bounded<10UL,_unsigned_char>)_kjCondition._31_1_);
    _kj_shouldLog =
         (bool)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_62);
    local_68 = __range2._4_4_;
    __range2._4_4_ = __range2._4_4_ + 1;
    kj::_::DebugExpression<kj::SafeUnwrapper<10ul,unsigned_char>>::operator==
              ((DebugComparison<kj::SafeUnwrapper<10UL,_unsigned_char>,_unsigned_int> *)local_60,
               (DebugExpression<kj::SafeUnwrapper<10ul,unsigned_char>> *)&_kj_shouldLog,&local_68);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_1._39_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<10ul,unsigned_char>,unsigned_int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x10e,ERROR,
                   "\"failed: expected \" \"unbound(value) == expected++\", _kjCondition",
                   (char (*) [46])"failed: expected unbound(value) == expected++",
                   (DebugComparison<kj::SafeUnwrapper<10UL,_unsigned_char>,_unsigned_int> *)local_60
                  );
        _kjCondition_1._39_1_ = 0;
      }
    }
    Range<kj::Bounded<10UL,_unsigned_int>_>::Iterator::operator++((Iterator *)&i);
  }
  DStack_a0 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&__range2 + 4))
  ;
  __range2_1._4_4_ = 10;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_98,
             (DebugExpression<unsigned_int&> *)&stack0xffffffffffffff60,
             (int *)((long)&__range2_1 + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar1) {
    __range2_1._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)__range2_1._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x110,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
                 (char (*) [32])"failed: expected expected == 10",
                 (DebugComparison<unsigned_int_&,_int> *)local_98);
      __range2_1._3_1_ = false;
    }
  }
  __range2._4_4_ = 0;
  _kjCondition_2._29_1_ = bounded<unsigned_char>('\n');
  _kjCondition_2._30_2_ =
       zeroTo<kj::Bounded<255ul,unsigned_char>>
                 ((Bounded<255UL,_unsigned_char>)_kjCondition_2._29_1_);
  _kjCondition_2._28_1_ =
       Range<kj::Bounded<255UL,_unsigned_char>_>::begin
                 ((Range<kj::Bounded<255UL,_unsigned_char>_> *)&_kjCondition_2.field_0x1e);
  _kjCondition_2._27_1_ =
       Range<kj::Bounded<255UL,_unsigned_char>_>::end
                 ((Range<kj::Bounded<255UL,_unsigned_char>_> *)&_kjCondition_2.field_0x1e);
  while (bVar1 = Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator==
                           ((Iterator *)&_kjCondition_2.field_0x1c,
                            (Iterator *)&_kjCondition_2.field_0x1b), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_db = (uchar)Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator*
                                ((Iterator *)&_kjCondition_2.field_0x1c);
    _kjCondition_2._25_1_ = local_db;
    _kjCondition_2._26_1_ = local_db;
    local_da = unbound<255ul,unsigned_char>((Bounded<255UL,_unsigned_char>)local_db);
    _kj_shouldLog_2 =
         (bool)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_da);
    local_e0 = __range2._4_4_;
    __range2._4_4_ = __range2._4_4_ + 1;
    kj::_::DebugExpression<kj::SafeUnwrapper<255ul,unsigned_char>>::operator==
              ((DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)local_d8,
               (DebugExpression<kj::SafeUnwrapper<255ul,unsigned_char>> *)&_kj_shouldLog_2,&local_e0
              );
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d8);
    if (!bVar1) {
      _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_3._39_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<255ul,unsigned_char>,unsigned_int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x115,ERROR,
                   "\"failed: expected \" \"unbound(value) == expected++\", _kjCondition",
                   (char (*) [46])"failed: expected unbound(value) == expected++",
                   (DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)
                   local_d8);
        _kjCondition_3._39_1_ = 0;
      }
    }
    Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator++
              ((Iterator *)&_kjCondition_2.field_0x1c);
  }
  DStack_118 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&__range2 + 4)
                         );
  __range2_2._4_4_ = 10;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_110,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffee8,
             (int *)((long)&__range2_2 + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
  if (!bVar1) {
    __range2_2._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)__range2_2._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x117,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
                 (char (*) [32])"failed: expected expected == 10",
                 (DebugComparison<unsigned_int_&,_int> *)local_110);
      __range2_2._3_1_ = false;
    }
  }
  __range2._4_4_ = 3;
  _kjCondition_4._29_1_ = bounded<unsigned_char>('\x03');
  _kjCondition_4._28_1_ = bounded<unsigned_char>('\n');
  _kjCondition_4._30_2_ =
       range<kj::Bounded<255ul,unsigned_char>>
                 ((Bounded<255UL,_unsigned_char>)_kjCondition_4._29_1_,
                  (Bounded<255UL,_unsigned_char>)_kjCondition_4._28_1_);
  _kjCondition_4._27_1_ =
       Range<kj::Bounded<255UL,_unsigned_char>_>::begin
                 ((Range<kj::Bounded<255UL,_unsigned_char>_> *)&_kjCondition_4.field_0x1e);
  _kjCondition_4._26_1_ =
       Range<kj::Bounded<255UL,_unsigned_char>_>::end
                 ((Range<kj::Bounded<255UL,_unsigned_char>_> *)&_kjCondition_4.field_0x1e);
  while (bVar1 = Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator==
                           ((Iterator *)&_kjCondition_4.field_0x1b,
                            (Iterator *)&_kjCondition_4.field_0x1a), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_153 = (uchar)Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator*
                                 ((Iterator *)&_kjCondition_4.field_0x1b);
    _kjCondition_4.result = (bool)local_153;
    _kjCondition_4._25_1_ = local_153;
    local_152 = unbound<255ul,unsigned_char>((Bounded<255UL,_unsigned_char>)local_153);
    _kj_shouldLog_4 =
         (bool)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_152);
    local_158 = __range2._4_4_;
    __range2._4_4_ = __range2._4_4_ + 1;
    kj::_::DebugExpression<kj::SafeUnwrapper<255ul,unsigned_char>>::operator==
              ((DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)local_150,
               (DebugExpression<kj::SafeUnwrapper<255ul,unsigned_char>> *)&_kj_shouldLog_4,
               &local_158);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
    if (!bVar1) {
      _kjCondition_5._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_5._39_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<255ul,unsigned_char>,unsigned_int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x11c,ERROR,
                   "\"failed: expected \" \"unbound(value) == expected++\", _kjCondition",
                   (char (*) [46])"failed: expected unbound(value) == expected++",
                   (DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)
                   local_150);
        _kjCondition_5._39_1_ = 0;
      }
    }
    Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator++
              ((Iterator *)&_kjCondition_4.field_0x1b);
  }
  DStack_190 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&__range2 + 4)
                         );
  local_194 = 10;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_188,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffe70,&local_194);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
  if (!bVar1) {
    local_195 = kj::_::Debug::shouldLog(ERROR);
    while (local_195 != false) {
      kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x11e,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
                 (char (*) [32])"failed: expected expected == 10",
                 (DebugComparison<unsigned_int_&,_int> *)local_188);
      local_195 = false;
    }
  }
  return;
}

Assistant:

TEST(UnitMeasure, BoundedRange) {
  uint expected = 0;
  for (auto i: zeroTo(bounded<10>())) {
    Bounded<10, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 0;
  for (auto i: zeroTo(bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 3;
  for (auto i: range(bounded((uint8_t)3), bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);
}